

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcpnatpmpc.c
# Opt level: O1

void parse_opt_dev_id(pcp_params *p)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  utsname sysinfo;
  
  uname((utsname *)&sysinfo);
  sVar2 = strlen(sysinfo.sysname);
  iVar3 = (int)sVar2;
  if (0 < 0x1f - iVar3) {
    strcpy((p->app_deviceid).deviceid,sysinfo.sysname);
    pcVar1 = (p->app_deviceid).deviceid + iVar3;
    pcVar1[0] = ' ';
    pcVar1[1] = '\0';
    sVar2 = strlen(sysinfo.machine);
    if ((int)sVar2 < 0x1f - iVar3) {
      strcpy((p->app_deviceid).deviceid + (long)iVar3 + 1,sysinfo.machine);
    }
  }
  fprintf(_stderr,"Device-id: %s \n",(p->app_deviceid).deviceid);
  return;
}

Assistant:

static inline void parse_opt_dev_id(struct pcp_params *p) {
#ifndef WIN32
    struct utsname sysinfo;
    int sysname_len, dev_len, machine_len;

    /* uname is not support on 4.3BSD and earlier */
    uname(&sysinfo);
    sysname_len = strlen((const char *)&sysinfo.sysname);
    dev_len = MAX_DEVICE_ID - sysname_len - 1;
    if (dev_len > 0) {
        strcpy(&(p->app_deviceid.deviceid[0]), (const char *)&sysinfo.sysname);
        strcpy(p->app_deviceid.deviceid + sysname_len, " ");

        machine_len = strlen((const char *)&sysinfo.machine);
        if (dev_len - machine_len > 0) {
            strcpy(p->app_deviceid.deviceid + sysname_len + 1,
                   (const char *)&sysinfo.machine);
        }
    }
    fprintf(stderr, "Device-id: %s \n", &(p->app_deviceid.deviceid[0]));

    /* BSD 4.3 version
    int len = 0, size = 0;
    sysctlbyname("hw.machine", NULL, &size, NULL, 0);

    if (len) {
     char *machine = malloc(len*sizeof(char));
     sysctlbyname("hw.machine", machine, &size, NULL, 0);
     fprintf (stderr, "Machine: %s \n", machine);
     free(machine);
     exit(0);
    }
    *
    */
#endif // WIN32
}